

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O2

void leveldb::ConsumeDecimalNumberRoundtripTest(uint64_t number,string *padding)

{
  bool b;
  uint64_t in_RDX;
  Slice local_220;
  unsigned_long local_210;
  size_type local_208;
  uint64_t result;
  uint64_t number_local;
  string input_string;
  string decimal_number;
  Tester local_1b0;
  
  number_local = number;
  NumberToString_abi_cxx11_(&decimal_number,(leveldb *)number,in_RDX);
  std::operator+(&input_string,&decimal_number,padding);
  local_220.data_ = input_string._M_dataplus._M_p;
  local_220.size_ = input_string._M_string_length;
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x30);
  b = ConsumeDecimalNumber(&local_220,&result);
  test::Tester::Is(&local_1b0,b,"ConsumeDecimalNumber(&output, &result)");
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x31);
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_1b0,&number_local,&result);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x32);
  local_208 = decimal_number._M_string_length;
  local_210 = (long)local_220.data_ - (long)input_string._M_dataplus._M_p;
  test::Tester::IsEq<unsigned_long,long>(&local_1b0,&local_208,(long *)&local_210);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x33);
  local_208 = padding->_M_string_length;
  local_210 = local_220.size_;
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_1b0,&local_208,&local_210);
  test::Tester::~Tester(&local_1b0);
  std::__cxx11::string::~string((string *)&input_string);
  std::__cxx11::string::~string((string *)&decimal_number);
  return;
}

Assistant:

void ConsumeDecimalNumberRoundtripTest(uint64_t number,
                                       const std::string& padding = "") {
  std::string decimal_number = NumberToString(number);
  std::string input_string = decimal_number + padding;
  Slice input(input_string);
  Slice output = input;
  uint64_t result;
  ASSERT_TRUE(ConsumeDecimalNumber(&output, &result));
  ASSERT_EQ(number, result);
  ASSERT_EQ(decimal_number.size(), output.data() - input.data());
  ASSERT_EQ(padding.size(), output.size());
}